

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

void __thiscall ON_String::TrimLeft(ON_String *this,char *s)

{
  int *piVar1;
  char cVar2;
  char *pcVar3;
  ON_Internal_Empty_aString *pOVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  uint uVar8;
  
  pcVar3 = this->m_s;
  pOVar4 = (ON_Internal_Empty_aString *)(pcVar3 + -0xc);
  if (pcVar3 == (char *)0x0) {
    pOVar4 = &empty_astring;
  }
  if (0 < (pOVar4->header).string_length) {
    if (s == (char *)0x0) {
      uVar8 = 0xffffffff;
      pcVar6 = pcVar3;
      do {
        cVar7 = *pcVar6;
        uVar8 = uVar8 + 1;
        if (cVar7 < '\x01') break;
        pcVar6 = pcVar6 + 1;
      } while (0x5d < (byte)(cVar7 - 0x21U));
    }
    else {
      cVar7 = *pcVar3;
      if (cVar7 == '\0') {
        uVar8 = 0;
      }
      else {
        lVar5 = 0;
        uVar8 = 0;
        pcVar6 = s;
LAB_005c1e99:
        do {
          cVar2 = *pcVar6;
          if (cVar2 != '\0') {
            pcVar6 = pcVar6 + 1;
            if (cVar2 != cVar7) goto LAB_005c1e99;
          }
          if (cVar2 == '\0') {
            uVar8 = (uint)lVar5;
            break;
          }
          uVar8 = uVar8 + 1;
          cVar7 = pcVar3[lVar5 + 1];
          lVar5 = lVar5 + 1;
          pcVar6 = s;
        } while (cVar7 != '\0');
      }
    }
    if (uVar8 != 0) {
      if (pcVar3[uVar8] == '\0') {
        Destroy(this);
        return;
      }
      CopyArray(this);
      pcVar3 = this->m_s;
      do {
        cVar7 = pcVar3[uVar8];
        *pcVar3 = cVar7;
        pcVar3 = pcVar3 + 1;
      } while (cVar7 != '\0');
      pOVar4 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar4 = &empty_astring;
      }
      piVar1 = &(pOVar4->header).string_length;
      *piVar1 = *piVar1 - uVar8;
    }
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}